

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float16 float16_muladd_ppc(float16 a,float16 b,float16 c,int flags,float_status *status)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  uint uVar7;
  int count;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t a0;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  FloatParts FVar22;
  FloatParts FVar23;
  FloatParts FVar24;
  FloatParts p;
  FloatParts b_00;
  ulong local_60;
  ulong local_58;
  uint64_t c_lo;
  uint64_t local_48;
  ulong local_40;
  uint64_t c_hi;
  
  local_58 = CONCAT44(in_register_0000000c,flags);
  FVar22._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar22.frac = (ulong)(a & 0x3ff);
  FVar22 = sf_canonicalize(FVar22,&float16_params,status);
  uVar8 = FVar22._8_8_;
  uVar21 = FVar22.frac;
  FVar23.frac = (ulong)(b & 0x3ff);
  FVar23._8_8_ = (ulong)(b >> 10 & 0x1f) | (ulong)(b & 0x8000) << 0x19;
  FVar23 = sf_canonicalize(FVar23,&float16_params,status);
  local_40 = FVar23.frac;
  FVar24._8_8_ = (ulong)(c >> 10 & 0x1f) | (ulong)(c & 0x8000) << 0x19;
  FVar24.frac = (ulong)(c & 0x3ff);
  FVar24 = sf_canonicalize(FVar24,&float16_params,status);
  uVar19 = FVar24.frac;
  uVar3 = 1 << (FVar23.cls & 0x1f) | 1 << (FVar22._12_4_ & 0x1f);
  if (((((undefined1  [16])FVar22 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0) ||
      (((undefined1  [16])FVar23 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) ||
     (((undefined1  [16])FVar24 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) {
    uVar21 = FVar23._8_8_ & 0xffffffffffff;
    b_00.exp = (int)uVar21;
    b_00.cls = (char)(uVar21 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar21 >> 0x28);
    b_00._14_2_ = (short)(uVar21 >> 0x30);
    b_00.frac = local_40;
    p = pick_nan_muladd(FVar22,b_00,FVar24,uVar3 == 10,status);
    goto LAB_00a5bb77;
  }
  if (uVar3 == 10) {
LAB_00a5ba18:
    p.exp = 0x7fffffff;
    p.cls = float_class_qnan;
    p.sign = false;
    p._14_2_ = 0;
    p.frac = 0x2000000000000000;
    status->float_exception_flags = status->float_exception_flags | 1;
    goto LAB_00a5bb77;
  }
  uVar7 = FVar22._12_4_ & 0xff;
  uVar3 = (uint)local_58;
  uVar16 = uVar3 & 4;
  uVar20 = 0x10000000000;
  uVar18 = FVar24._8_8_ & 0xffff0103ffffffff ^ 0x10000000000;
  if ((local_58 & 1) == 0) {
    uVar18 = FVar24._8_8_;
  }
  uVar9 = (FVar23._8_8_ ^ uVar8) & 0x10000000000;
  uVar15 = (ulong)(uVar9 == 0);
  if ((local_58 & 2) == 0) {
    uVar15 = uVar9 >> 0x28;
  }
  uVar14 = (uint)uVar15;
  uVar2 = (uint)(uVar18 >> 0x20);
  if ((uVar7 == 3) || (uVar6 = FVar23._12_4_ & 0xff, uVar6 == 3)) {
    if ((~uVar18 & 0x300000000) == 0) {
      uVar3 = uVar2 >> 8 & 1;
      if (uVar3 == uVar14) goto LAB_00a5bb22;
      goto LAB_00a5ba18;
    }
    if (uVar16 >> 2 == uVar14) {
      uVar20 = 0;
    }
    uVar20 = uVar20 | uVar8 & 0xffff0000ffffffff | 0x300000000;
LAB_00a5bb72:
    p.exp = (int)uVar20;
    p.cls = (char)(uVar20 >> 0x20);
    p.sign = (_Bool)(char)(uVar20 >> 0x28);
    p._14_2_ = (short)(uVar20 >> 0x30);
    p.frac = uVar21;
    goto LAB_00a5bb77;
  }
  uVar4 = uVar2 & 3;
  if (uVar4 == 3) {
    uVar3 = uVar2 >> 8 & 1;
LAB_00a5bb22:
    if (uVar3 == uVar16 >> 2) {
      uVar20 = 0;
    }
    uVar20 = uVar20 | uVar8 & 0xffff0000ffffffff | 0x300000000;
    goto LAB_00a5bb72;
  }
  uVar17 = (uint)uVar18;
  if ((uVar7 == 1) || (uVar6 == 1)) {
    if (uVar4 == 1) {
      if ((uVar2 >> 8 & 1) != uVar14) {
        uVar15 = (ulong)(status->float_rounding_mode == '\x01');
      }
      uVar18 = uVar18 & 0xffff0003ffffffff | uVar15 << 0x28;
    }
    else if ((local_58 & 8) != 0) {
      uVar18 = uVar18 & 0xffffff0300000000 | (ulong)(uVar17 - 1);
    }
    if (((uint)(uVar18 >> 0x28) & 1) == uVar16 >> 2) {
      uVar20 = 0;
    }
    uVar20 = uVar20 | uVar18 & 0xffff00ffffffffff;
    p.exp = (int)uVar20;
    p.cls = (char)(uVar20 >> 0x20);
    p.sign = (_Bool)(char)(uVar20 >> 0x28);
    p._14_2_ = (short)(uVar20 >> 0x30);
    p.frac = uVar19;
    goto LAB_00a5bb77;
  }
  if ((uVar7 != 2) || (uVar6 != 2)) {
    __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                  ,0x58e,
                  "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                 );
  }
  uVar9 = (uVar21 & 0xffffffff) * (local_40 >> 0x20);
  uVar11 = (local_40 & 0xffffffff) * (uVar21 >> 0x20);
  lVar13 = 0;
  uVar12 = uVar11 + uVar9;
  if (CARRY8(uVar11,uVar9)) {
    lVar13 = 0x100000000;
  }
  uVar10 = local_40 * uVar21;
  a0 = (uVar12 >> 0x20) + (local_40 >> 0x20) * (uVar21 >> 0x20) + lVar13 +
       (ulong)(uVar10 < uVar12 << 0x20);
  uVar7 = FVar23.exp + FVar22.exp;
  if ((a0 >> 0x3d & 1) != 0) {
    uVar10 = (ulong)((uint)uVar10 & 1) | a0 << 0x3f | uVar10 >> 1;
    a0 = a0 >> 1;
    uVar7 = uVar7 + 1;
  }
  local_60 = uVar10;
  local_48 = a0;
  if (uVar4 == 1) {
    uVar10 = (ulong)((uVar10 & 0x3fffffffffffffff) != 0) | a0 << 2 | uVar10 >> 0x3e;
  }
  else {
    count = uVar7 - uVar17;
    if ((uVar2 >> 8 & 1) == uVar14) {
      if (count < 1) {
        shift128RightJamming(a0,uVar10,0x3e - count,&local_48,&local_60);
        uVar10 = uVar19 + local_60;
      }
      else {
        c_hi = uVar19 >> 2;
        c_lo = 0;
        shift128RightJamming(c_hi,0,count,&c_hi,&c_lo);
        uVar10 = (ulong)((uVar10 + c_lo & 0x3fffffffffffffff) != 0) |
                 (a0 + c_hi + (ulong)CARRY8(uVar10,c_lo)) * 4 | uVar10 + c_lo >> 0x3e;
        uVar18 = (ulong)uVar7;
      }
      uVar7 = (uint)uVar18;
      uVar3 = (uint)local_58;
      if ((long)uVar10 < 0) {
        uVar10 = (ulong)((uint)uVar10 & 1) | uVar10 >> 1;
        uVar7 = uVar7 + 1;
      }
    }
    else {
      uVar19 = uVar19 >> 2;
      c_lo = 0;
      c_hi = uVar19;
      if (count < 1) {
        shift128RightJamming(a0,uVar10,-count,&local_48,&local_60);
        if ((uVar7 == uVar17) && (uVar11 = local_48 - uVar19, uVar9 = local_60, uVar19 <= local_48))
        goto LAB_00a5be60;
        uVar9 = -local_60;
        uVar11 = (uVar19 - local_48) - (ulong)(local_60 != 0);
        uVar14 = (uint)(byte)((byte)uVar15 ^ 1);
      }
      else {
        shift128RightJamming(uVar19,0,count,&c_hi,&c_lo);
        uVar11 = (a0 - c_hi) - (ulong)(uVar10 < c_lo);
        uVar9 = uVar10 - c_lo;
LAB_00a5be60:
        uVar18 = (ulong)uVar7;
      }
      if (uVar11 == 0 && uVar9 == 0) {
        if (uVar16 >> 2 == (uint)(status->float_rounding_mode == '\x01')) {
          uVar20 = 0;
        }
        uVar20 = (uVar20 | uVar8 & 0xffff0000ffffffff) + 0x100000000;
        goto LAB_00a5bb72;
      }
      uVar3 = (uint)local_58;
      if (uVar11 == 0) {
        if (uVar9 == 0) {
          uVar21 = 0x40;
        }
        else {
          uVar21 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar21 == 0; uVar21 = uVar21 - 1) {
            }
          }
          uVar21 = uVar21 ^ 0x3f;
        }
        if (uVar21 == 0) {
          uVar7 = 0x40;
          goto LAB_00a5be86;
        }
        uVar7 = (int)uVar21 + 0x40;
        uVar10 = uVar9 << ((char)uVar21 - 1U & 0x3f);
      }
      else {
        lVar13 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar7 = (uint)lVar13 ^ 0x3f;
LAB_00a5be86:
        bVar5 = (char)uVar7 - 1;
        bVar1 = bVar5 & 0x3f;
        uVar10 = (ulong)(uVar9 << (bVar5 & 0x3f) != 0) | uVar11 << bVar1 | uVar9 >> 0x40 - bVar1;
      }
      uVar7 = ((int)uVar18 - uVar7) + 3;
    }
  }
  if (uVar16 >> 2 == uVar14) {
    uVar20 = 0;
  }
  uVar21 = uVar20 | uVar8 & 0xffff000000000000 | (ulong)(((int)(uVar3 << 0x1c) >> 0x1f) + uVar7) |
           0x200000000;
  p.exp = (int)uVar21;
  p.cls = (char)(uVar21 >> 0x20);
  p.sign = (_Bool)(char)(uVar21 >> 0x28);
  p._14_2_ = (short)(uVar21 >> 0x30);
  p.frac = uVar10;
LAB_00a5bb77:
  FVar22 = round_canonical(p,status,&float16_params);
  return (ushort)FVar22.frac & 0x3ff | (ushort)((FVar22.exp & 0x1fU) << 10) |
         (ushort)(FVar22._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 QEMU_FLATTEN float16_muladd(float16 a, float16 b, float16 c,
                                                int flags, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pc = float16_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float16_round_pack_canonical(pr, status);
}